

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O0

bool __thiscall CDBWrapper::ExistsImpl(CDBWrapper *this,Span<const_std::byte> key)

{
  DB *pDVar1;
  string_view source_file;
  string_view logging_function;
  bool bVar2;
  LevelDBContext *pLVar3;
  size_t in_RDX;
  char *in_RSI;
  Status *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000a0;
  Status status;
  Slice slKey;
  string strValue;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  char *in_stack_fffffffffffffef0;
  Slice *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff5c;
  bool local_91;
  undefined1 local_70 [8];
  ConstevalFormatString<1U> in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffb8;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Span<const_std::byte>::data
            ((Span<const_std::byte> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
  ;
  CharCast((byte *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  Span<const_std::byte>::size
            ((Span<const_std::byte> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
  ;
  leveldb::Slice::Slice
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  std::__cxx11::string::string(in_stack_ffffffffffffff00);
  pLVar3 = DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pDVar1 = pLVar3->pdb;
  pLVar3 = DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  (*pDVar1->_vptr_DB[5])(local_70,pDVar1,&pLVar3->readoptions,&stack0xffffffffffffff98,local_28);
  bVar2 = leveldb::Status::ok((Status *)
                              CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (!bVar2) {
    bVar2 = leveldb::Status::IsNotFound
                      ((Status *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    if (bVar2) {
      local_91 = false;
      goto LAB_008cee57;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00);
    leveldb::Status::ToString_abi_cxx11_((Status *)"LevelDB read failure: %s\n");
    in_stack_fffffffffffffee8 = 2;
    logging_function._M_str = in_stack_ffffffffffffffb8;
    logging_function._M_len = in_RDX;
    source_file._M_str = in_RSI;
    source_file._M_len = in_stack_ffffffffffffffa0;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,in_stack_ffffffffffffff5c,
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_00000090,
               in_stack_ffffffffffffff98,in_stack_000000a0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    HandleError(in_RDI);
  }
  local_91 = true;
LAB_008cee57:
  leveldb::Status::~Status((Status *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_91;
  }
  __stack_chk_fail();
}

Assistant:

bool CDBWrapper::ExistsImpl(Span<const std::byte> key) const
{
    leveldb::Slice slKey(CharCast(key.data()), key.size());

    std::string strValue;
    leveldb::Status status = DBContext().pdb->Get(DBContext().readoptions, slKey, &strValue);
    if (!status.ok()) {
        if (status.IsNotFound())
            return false;
        LogPrintf("LevelDB read failure: %s\n", status.ToString());
        HandleError(status);
    }
    return true;
}